

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

lws_http_mount * lws_find_mount(lws *wsi,char *uri_ptr,int uri_len)

{
  byte bVar1;
  lws_http_mount *plVar2;
  byte bVar3;
  int iVar4;
  byte bVar5;
  lws_http_mount *plVar6;
  lws_http_mount *local_38;
  
  plVar6 = (lws_http_mount *)&(((wsi->a).vhost)->http).mount_list;
  local_38 = (lws_http_mount *)0x0;
  plVar2 = local_38;
  bVar3 = 0;
  while (bVar5 = bVar3, local_38 = plVar2, plVar6 = plVar6->mount_next,
        plVar6 != (lws_http_mount *)0x0) {
    bVar1 = plVar6->mountpoint_len;
    plVar2 = local_38;
    bVar3 = bVar5;
    if (((((int)(uint)bVar1 <= uri_len) &&
         (iVar4 = strncmp(uri_ptr,plVar6->mountpoint,(ulong)bVar1), iVar4 == 0)) &&
        ((uri_ptr[bVar1] == '\0' || ((uri_ptr[bVar1] == '/' || (bVar1 == 1)))))) &&
       ((plVar6->origin_protocol == '\x03' ||
        ((plVar2 = plVar6, bVar3 = bVar1, plVar6->origin_protocol != '\x06' &&
         (((((iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_GET_URI), iVar4 != 0 ||
             (iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_POST_URI), iVar4 != 0)) ||
            (iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_PUT_URI), iVar4 != 0)) ||
           ((iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_PATCH_URI), iVar4 != 0 ||
            (iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_DELETE_URI), iVar4 != 0)))) ||
          (((iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_HEAD_URI), iVar4 != 0 ||
            (((wsi->field_0x46e & 2) != 0 &&
             (iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_COLON_PATH), iVar4 != 0)))) ||
           (plVar2 = local_38, bVar3 = bVar5, plVar6->protocol != (char *)0x0)))))))))) {
      bVar1 = plVar6->mountpoint_len;
      if (bVar5 < bVar1) {
        local_38 = plVar6;
      }
      plVar2 = local_38;
      bVar3 = bVar5;
      if (bVar5 <= bVar1) {
        bVar3 = bVar1;
      }
    }
  }
  return local_38;
}

Assistant:

const struct lws_http_mount *
lws_find_mount(struct lws *wsi, const char *uri_ptr, int uri_len)
{
	const struct lws_http_mount *hm, *hit = NULL;
	int best = 0;

	hm = wsi->a.vhost->http.mount_list;
	while (hm) {
		if (uri_len >= hm->mountpoint_len &&
		    !strncmp(uri_ptr, hm->mountpoint, hm->mountpoint_len) &&
		    (uri_ptr[hm->mountpoint_len] == '\0' ||
		     uri_ptr[hm->mountpoint_len] == '/' ||
		     hm->mountpoint_len == 1)
		    ) {
#if defined(LWS_WITH_SYS_METRICS)
			lws_metrics_tag_wsi_add(wsi, "mnt", hm->mountpoint);
#endif

			if (hm->origin_protocol == LWSMPRO_CALLBACK ||
			    ((hm->origin_protocol == LWSMPRO_CGI ||
			     lws_hdr_total_length(wsi, WSI_TOKEN_GET_URI) ||
			     lws_hdr_total_length(wsi, WSI_TOKEN_POST_URI) ||
#if defined(LWS_WITH_HTTP_UNCOMMON_HEADERS)
			     lws_hdr_total_length(wsi, WSI_TOKEN_PUT_URI) ||
			     lws_hdr_total_length(wsi, WSI_TOKEN_PATCH_URI) ||
			     lws_hdr_total_length(wsi, WSI_TOKEN_DELETE_URI) ||
#endif
			     lws_hdr_total_length(wsi, WSI_TOKEN_HEAD_URI) ||
#if defined(LWS_ROLE_H2)
			     (wsi->mux_substream &&
				lws_hdr_total_length(wsi,
						WSI_TOKEN_HTTP_COLON_PATH)) ||
#endif
			     hm->protocol) &&
			    hm->mountpoint_len > best)) {
				best = hm->mountpoint_len;
				hit = hm;
			}
		}
		hm = hm->mount_next;
	}

	return hit;
}